

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  ConductorBxDF *pCVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector3<float> args;
  bool bVar11;
  BxDFFlags BVar12;
  int iVar13;
  uint64_t sequenceIndex;
  uint64_t seed;
  pbrt *this_00;
  SampledSpectrum *this_01;
  uint uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  float fVar17;
  Float FVar18;
  Float FVar19;
  float fVar20;
  float fVar21;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar39 [64];
  undefined1 auVar70 [56];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 extraout_var [56];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar59 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dd;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar108 [16];
  undefined1 in_register_00001384 [12];
  Vector3<float> args_1;
  SampledSpectrum SVar109;
  Vector3f w;
  undefined1 local_228 [16];
  SampledSpectrum local_218;
  undefined1 local_208 [16];
  SampledSpectrum fExit;
  HGPhaseFunction phase;
  PhaseFunctionSample ps;
  float fStack_1b4;
  float local_1b0;
  float local_1ac;
  Tuple3<pbrt::Vector3,_float> local_1a0;
  SampledSpectrum *local_190;
  Point2f u;
  Point2f u_1;
  undefined8 uStack_178;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_170;
  Point2f u_2;
  float fStack_158;
  float fStack_154;
  Tuple3<pbrt::Vector3,_float> local_150;
  SampledSpectrum local_140;
  anon_class_8_1_ba1d750b r;
  Vector3f local_128;
  float local_118;
  TransportMode local_114;
  float local_110;
  BSDFSample wis;
  SampledSpectrum local_e8;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_d8;
  undefined1 local_c8 [16];
  ulong local_b0;
  Tuple3<pbrt::Vector3,_float> local_a8;
  SampledSpectrum beta;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_88;
  BSDFSample wos;
  SampledSpectrum betaExit;
  RNG rng;
  undefined1 auVar107 [56];
  
  uVar15 = in_register_00001384._4_8_;
  fVar17 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar76._8_56_ = wi._8_56_;
  auVar76._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_128.super_Tuple3<pbrt::Vector3,_float>.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar39._8_56_ = wo._8_56_;
  auVar39._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16 = auVar39._0_16_;
  local_128.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar16);
  local_c8 = auVar76._0_16_;
  local_1a0._0_8_ = vmovlps_avx(local_c8);
  local_208._4_4_ = in_XMM1_Db;
  local_208._0_4_ = local_128.super_Tuple3<pbrt::Vector3,_float>.z;
  local_208._8_4_ = 0;
  local_208._12_4_ = in_XMM1_Dd;
  local_1a0.z = fVar17;
  SampledSpectrum::SampledSpectrum(&local_e8,0.0);
  if ((this->config).twoSided == '\0') {
    auVar39 = ZEXT1664(auVar16);
  }
  else if (0.0 <= local_208._0_4_) {
    auVar39 = ZEXT1664(auVar16);
  }
  else {
    auVar71._0_8_ = local_c8._0_8_ ^ 0x8000000080000000;
    auVar71._8_4_ = local_c8._8_4_ ^ 0x80000000;
    auVar71._12_4_ = local_c8._12_4_ ^ 0x80000000;
    auVar16._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
    auVar16._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    auVar16._12_4_ = wo._12_4_ ^ 0x80000000;
    auVar39 = ZEXT1664(auVar16);
    auVar108._0_8_ = local_208._0_8_ ^ 0x8000000080000000;
    auVar108._8_4_ = local_208._8_4_ ^ 0x80000000;
    auVar108._12_4_ = local_208._12_4_ ^ 0x80000000;
    fVar17 = -fVar17;
    local_128.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar16);
    local_1a0._0_8_ = vmovlps_avx(auVar71);
    local_128.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar108._0_8_;
    local_1a0.z = fVar17;
    local_208 = auVar108;
  }
  fVar20 = local_208._0_4_;
  pCVar1 = &this->bottom;
  local_d8.bottom = (ConductorBxDF *)0x0;
  local_88.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)->top;
  if (0.0 < fVar20) {
    local_88.top = &this->top;
  }
  local_88.bottom = pCVar1;
  if (0.0 < fVar20) {
    local_88.bottom =
         (ConductorBxDF *)(LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
  }
  bVar11 = 0.0 < fVar20 * fVar17 == 0.0 < fVar20;
  local_170.top = &this->top;
  if (!bVar11) {
    local_170.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)->top;
  }
  local_d8.top = &this->top;
  local_170.bottom = pCVar1;
  if (bVar11) {
    local_d8.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)->top;
    local_170.bottom = (ConductorBxDF *)0x0;
    local_d8.bottom = pCVar1;
  }
  local_c8 = ZEXT416((uint)bVar11 * (int)this->thickness);
  auVar76 = ZEXT1664(local_208);
  auVar107 = ZEXT856(local_208._8_8_);
  if (0.0 < fVar20 * fVar17) {
    bVar2 = (this->config).nSamples;
    auVar70 = ZEXT856(uVar15);
    SVar109 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                        (&local_88,&local_128,(Vector3f *)&local_1a0,mode);
    auVar77._0_8_ = SVar109.values.values._8_8_;
    auVar77._8_56_ = auVar107;
    auVar40._0_8_ = SVar109.values.values._0_8_;
    auVar40._8_56_ = auVar70;
    wos.f.values.values = (array<float,_4>)vmovlhps_avx(auVar40._0_16_,auVar77._0_16_);
    auVar70 = (undefined1  [56])0x0;
    SVar109 = SampledSpectrum::operator*(&wos.f,(float)bVar2);
    auVar78._0_8_ = SVar109.values.values._8_8_;
    auVar78._8_56_ = auVar107;
    auVar41._0_8_ = SVar109.values.values._0_8_;
    auVar41._8_56_ = auVar70;
    local_e8.values.values = (array<float,_4>)vmovlhps_avx(auVar41._0_16_,auVar78._0_16_);
    auVar76 = ZEXT464((uint)local_128.super_Tuple3<pbrt::Vector3,_float>.z);
    auVar39 = ZEXT864((ulong)local_128.super_Tuple3<pbrt::Vector3,_float>._0_8_);
  }
  this_00 = (pbrt *)(ulong)*(uint *)(Options + 4);
  args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar39._0_8_;
  args_1.super_Tuple3<pbrt::Vector3,_float>.z = auVar76._0_4_;
  sequenceIndex = Hash<int,pbrt::Vector3<float>>(*(uint *)(Options + 4),args_1);
  args.super_Tuple3<pbrt::Vector3,_float>.z = local_1a0.z;
  args.super_Tuple3<pbrt::Vector3,_float>.x = local_1a0.x;
  args.super_Tuple3<pbrt::Vector3,_float>.y = local_1a0.y;
  seed = Hash<pbrt::Vector3<float>>(this_00,args);
  RNG::SetSequence(&rng,sequenceIndex,seed);
  uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)local_208._0_4_),1);
  this_01 = &this->albedo;
  uVar15 = 0;
  local_114 = (TransportMode)(mode == Radiance);
  local_190 = this_01;
  r.rng = &rng;
  do {
    bVar2 = (this->config).nSamples;
    if ((uint)bVar2 <= (uint)uVar15) {
      SVar109 = SampledSpectrum::operator/(&local_e8,(float)bVar2);
      return (array<float,_4>)(array<float,_4>)SVar109;
    }
    fVar17 = f::anon_class_8_1_ba1d750b::operator()(&r);
    local_208._0_4_ = fVar17;
    fVar17 = f::anon_class_8_1_ba1d750b::operator()(&r);
    u.super_Tuple2<pbrt::Point2,_float>.y = f::anon_class_8_1_ba1d750b::operator()(&r);
    u.super_Tuple2<pbrt::Point2,_float>.x = fVar17;
    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
              (&wos,&local_88,&local_128,(Float)local_208._0_4_,&u,mode,Transmission);
    if ((0.0 < wos.pdf) &&
       ((wos.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
        (NAN(wos.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) {
      fVar17 = f::anon_class_8_1_ba1d750b::operator()(&r);
      local_208._0_4_ = fVar17;
      fVar17 = f::anon_class_8_1_ba1d750b::operator()(&r);
      u.super_Tuple2<pbrt::Point2,_float>.y = f::anon_class_8_1_ba1d750b::operator()(&r);
      auVar107 = (undefined1  [56])0x0;
      u.super_Tuple2<pbrt::Point2,_float>.x = fVar17;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                (&wis,&local_170,(Vector3f *)&local_1a0,(Float)local_208._0_4_,&u,local_114,
                 Transmission);
      if ((0.0 < wis.pdf) &&
         ((wis.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
          (NAN(wis.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) {
        auVar5._8_4_ = 0x7fffffff;
        auVar5._0_8_ = 0x7fffffff7fffffff;
        auVar5._12_4_ = 0x7fffffff;
        auVar16 = vandps_avx512vl(ZEXT416((uint)wos.wi.super_Tuple3<pbrt::Vector3,_float>.z),auVar5)
        ;
        auVar70 = ZEXT856(auVar16._8_8_);
        local_b0 = uVar15;
        SVar109 = SampledSpectrum::operator*(&wos.f,auVar16._0_4_);
        auVar79._0_8_ = SVar109.values.values._8_8_;
        auVar79._8_56_ = auVar107;
        auVar42._0_8_ = SVar109.values.values._0_8_;
        auVar42._8_56_ = auVar70;
        ps._0_16_ = vmovlhps_avx(auVar42._0_16_,auVar79._0_16_);
        auVar70 = (undefined1  [56])0x0;
        SVar109 = SampledSpectrum::operator/((SampledSpectrum *)&ps,wos.pdf);
        auVar80._0_8_ = SVar109.values.values._8_8_;
        auVar80._8_56_ = auVar107;
        auVar43._0_8_ = SVar109.values.values._0_8_;
        auVar43._8_56_ = auVar70;
        beta.values.values = (array<float,_4>)vmovlhps_avx(auVar43._0_16_,auVar80._0_16_);
        auVar70 = (undefined1  [56])0x0;
        SVar109 = SampledSpectrum::operator/(&wis.f,wis.pdf);
        auVar81._0_8_ = SVar109.values.values._8_8_;
        auVar81._8_56_ = auVar107;
        auVar44._0_8_ = SVar109.values.values._0_8_;
        auVar44._8_56_ = auVar70;
        betaExit.values.values = (array<float,_4>)vmovlhps_avx(auVar44._0_16_,auVar81._0_16_);
        uVar14 = 0;
        w.super_Tuple3<pbrt::Vector3,_float>.z = wos.wi.super_Tuple3<pbrt::Vector3,_float>.z;
        w.super_Tuple3<pbrt::Vector3,_float>.x = wos.wi.super_Tuple3<pbrt::Vector3,_float>.x;
        w.super_Tuple3<pbrt::Vector3,_float>.y = wos.wi.super_Tuple3<pbrt::Vector3,_float>.y;
        phase.g = this->g;
        local_208 = ZEXT416((uint)((byte)uVar3 & 1) * (int)this->thickness);
        while( true ) {
          uVar15 = local_b0;
          if ((this->config).maxDepth <= uVar14) break;
          if ((3 < uVar14) && (FVar18 = SampledSpectrum::MaxComponentValue(&beta), FVar18 < 0.25)) {
            FVar18 = SampledSpectrum::MaxComponentValue(&beta);
            auVar16 = vmaxss_avx(ZEXT416((uint)(1.0 - FVar18)),ZEXT416(0));
            fVar17 = f::anon_class_8_1_ba1d750b::operator()(&r);
            uVar15 = local_b0;
            if (fVar17 < auVar16._0_4_) break;
            SampledSpectrum::operator/=(&beta,1.0 - auVar16._0_4_);
          }
          bVar11 = SampledSpectrum::operator_cast_to_bool(this_01);
          if (bVar11) {
            fVar17 = f::anon_class_8_1_ba1d750b::operator()(&r);
            auVar6._8_4_ = 0x7fffffff;
            auVar6._0_8_ = 0x7fffffff7fffffff;
            auVar6._12_4_ = 0x7fffffff;
            auVar16 = vandps_avx512vl(ZEXT416((uint)w.super_Tuple3<pbrt::Vector3,_float>.z),auVar6);
            local_228._0_4_ = SampleExponential(fVar17,1.0 / auVar16._0_4_);
            local_228._4_4_ = extraout_XMM0_Db;
            local_228._8_4_ = extraout_XMM0_Dc;
            local_228._12_4_ = extraout_XMM0_Dd;
            auVar22._0_12_ = ZEXT412(0);
            auVar22._12_4_ = 0;
            uVar4 = vcmpss_avx512f(auVar22,ZEXT416((uint)w.super_Tuple3<pbrt::Vector3,_float>.z),1);
            if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                 f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0') &&
               (iVar13 = __cxa_guard_acquire(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                              ::
                                              f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                              ::reg), iVar13 != 0)) {
              StatRegisterer::StatRegisterer
                        ((StatRegisterer *)
                         &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                          f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg,
                         const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                         (PixelAccumFunc)0x0);
              __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                                   f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                   ::reg);
            }
            *(long *)(in_FS_OFFSET + -0x5b8) = *(long *)(in_FS_OFFSET + -0x5b8) + 1;
            auVar7._8_4_ = 0x80000000;
            auVar7._0_8_ = 0x8000000080000000;
            auVar7._12_4_ = 0x80000000;
            auVar16 = vxorps_avx512vl(local_228,auVar7);
            auVar107 = ZEXT856((ulong)local_208._8_8_);
            fVar20 = local_208._0_4_;
            fVar17 = fVar20 + (float)((uint)((byte)uVar4 & 1) * local_228._0_4_ +
                                     (uint)!(bool)((byte)uVar4 & 1) * auVar16._0_4_);
            if ((fVar20 != fVar17) || (NAN(fVar20) || NAN(fVar17))) {
              if ((fVar17 <= 0.0) || (this->thickness <= fVar17)) {
                auVar16 = vminss_avx(ZEXT416((uint)this->thickness),ZEXT416((uint)fVar17));
                auVar38._0_12_ = ZEXT812(0);
                auVar38._12_4_ = 0;
                uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar17),auVar38,1);
                local_208._4_12_ = auVar16._4_12_;
                local_208._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar16._0_4_;
                goto LAB_0039d4f9;
              }
              BVar12 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                 (&local_170);
              FVar18 = wis.pdf;
              fVar20 = 1.0;
              if ((BVar12 & Specular) == Unset) {
                auVar31._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                auVar31._8_4_ = 0x80000000;
                auVar31._12_4_ = 0x80000000;
                uVar4 = vmovlps_avx(auVar31);
                ps.wi.super_Tuple3<pbrt::Vector3,_float>.y = -w.super_Tuple3<pbrt::Vector3,_float>.z
                ;
                ps.p = (Float)(int)uVar4;
                ps.wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uVar4 >> 0x20);
                auVar32._0_8_ = wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                ;
                auVar32._8_4_ = 0x80000000;
                auVar32._12_4_ = 0x80000000;
                uVar4 = vmovlps_avx(auVar32);
                fExit.values.values[2] = -wis.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                fExit.values.values[0] = (float)(int)uVar4;
                fExit.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
                FVar19 = HGPhaseFunction::p(&phase,(Vector3f *)&ps,(Vector3f *)&fExit);
                auVar16 = vfmadd231ss_fma(ZEXT416((uint)(FVar19 * FVar19)),ZEXT416((uint)FVar18),
                                          ZEXT416((uint)FVar18));
                auVar107 = (undefined1  [56])0x0;
                fVar20 = (FVar18 * FVar18) / auVar16._0_4_;
              }
              local_118 = fVar17 - (float)local_c8._0_4_;
              local_110 = fVar20;
              FVar18 = Tr(local_118,&wis.wi);
              auVar70 = extraout_var_01;
              SVar109 = SampledSpectrum::operator*(&beta,this_01);
              auVar96._0_8_ = SVar109.values.values._8_8_;
              auVar96._8_56_ = auVar107;
              auVar59._0_8_ = SVar109.values.values._0_8_;
              auVar59._8_56_ = auVar70;
              local_140.values.values = (array<float,_4>)vmovlhps_avx(auVar59._0_16_,auVar96._0_16_)
              ;
              auVar33._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar33._8_4_ = 0x80000000;
              auVar33._12_4_ = 0x80000000;
              uVar4 = vmovlps_avx(auVar33);
              fStack_158 = -w.super_Tuple3<pbrt::Vector3,_float>.z;
              u_2.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)uVar4;
              u_2.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
              auVar34._0_8_ = wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar34._8_4_ = 0x80000000;
              auVar34._12_4_ = 0x80000000;
              auVar74._0_8_ =
                   CONCAT44(0x80000000,wis.wi.super_Tuple3<pbrt::Vector3,_float>.z) ^ 0x80000000;
              auVar74._8_4_ = 0x80000000;
              auVar74._12_4_ = 0x80000000;
              auVar70 = ZEXT856(auVar74._8_8_);
              local_150._0_8_ = vmovlps_avx(auVar34);
              local_150.z = (float)auVar74._0_8_;
              FVar19 = HGPhaseFunction::p(&phase,(Vector3f *)&u_2,(Vector3f *)&local_150);
              auVar107 = extraout_var_02;
              SVar109 = SampledSpectrum::operator*(&local_140,FVar19);
              auVar97._0_8_ = SVar109.values.values._8_8_;
              auVar97._8_56_ = auVar70;
              auVar60._0_8_ = SVar109.values.values._0_8_;
              auVar60._8_56_ = auVar107;
              _u_1 = (array<float,_4>)vmovlhps_avx(auVar60._0_16_,auVar97._0_16_);
              auVar107 = (undefined1  [56])0x0;
              SVar109 = SampledSpectrum::operator*((SampledSpectrum *)&u_1,local_110);
              auVar98._0_8_ = SVar109.values.values._8_8_;
              auVar98._8_56_ = auVar70;
              auVar61._0_8_ = SVar109.values.values._0_8_;
              auVar61._8_56_ = auVar107;
              local_218.values.values = (array<float,_4>)vmovlhps_avx(auVar61._0_16_,auVar98._0_16_)
              ;
              auVar107 = (undefined1  [56])0x0;
              SVar109 = SampledSpectrum::operator*(&local_218,FVar18);
              auVar99._0_8_ = SVar109.values.values._8_8_;
              auVar99._8_56_ = auVar70;
              auVar62._0_8_ = SVar109.values.values._0_8_;
              auVar62._8_56_ = auVar107;
              fExit.values.values = (array<float,_4>)vmovlhps_avx(auVar62._0_16_,auVar99._0_16_);
              auVar107 = ZEXT856(fExit.values.values._8_8_);
              SVar109 = SampledSpectrum::operator*(&fExit,&betaExit);
              auVar100._0_8_ = SVar109.values.values._8_8_;
              auVar100._8_56_ = auVar70;
              auVar63._0_8_ = SVar109.values.values._0_8_;
              auVar63._8_56_ = auVar107;
              ps._0_16_ = vmovlhps_avx(auVar63._0_16_,auVar100._0_16_);
              SampledSpectrum::operator+=(&local_e8,(SampledSpectrum *)&ps);
              auVar35._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar35._8_4_ = 0x80000000;
              auVar35._12_4_ = 0x80000000;
              uVar4 = vmovlps_avx(auVar35);
              fExit.values.values[2] = -w.super_Tuple3<pbrt::Vector3,_float>.z;
              fExit.values.values[0] = (float)(int)uVar4;
              fExit.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
              fVar20 = f::anon_class_8_1_ba1d750b::operator()(&r);
              fVar21 = f::anon_class_8_1_ba1d750b::operator()(&r);
              local_218.values.values[1] = fVar21;
              local_218.values.values[0] = fVar20;
              HGPhaseFunction::Sample_p(&ps,&phase,(Vector3f *)&fExit,(Point2f *)&local_218);
              auVar107 = ZEXT856(0);
              this_01 = local_190;
              if (0.0 < ps.pdf) {
                if ((ps.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
                   (NAN(ps.wi.super_Tuple3<pbrt::Vector3,_float>.z))) {
                  auVar70 = (undefined1  [56])0x0;
                  SVar109 = SampledSpectrum::operator*(local_190,ps.p);
                  auVar101._0_8_ = SVar109.values.values._8_8_;
                  auVar101._8_56_ = auVar107;
                  auVar64._0_8_ = SVar109.values.values._0_8_;
                  auVar64._8_56_ = auVar70;
                  local_218.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar64._0_16_,auVar101._0_16_);
                  auVar70 = (undefined1  [56])0x0;
                  SVar109 = SampledSpectrum::operator/(&local_218,ps.pdf);
                  auVar102._0_8_ = SVar109.values.values._8_8_;
                  auVar102._8_56_ = auVar107;
                  auVar65._0_8_ = SVar109.values.values._0_8_;
                  auVar65._8_56_ = auVar70;
                  fExit.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar65._0_16_,auVar102._0_16_);
                  SampledSpectrum::operator*=(&beta,&fExit);
                  auVar16 = (undefined1  [16])ps._0_16_;
                  w.super_Tuple3<pbrt::Vector3,_float>.x =
                       ps.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                  w.super_Tuple3<pbrt::Vector3,_float>.y =
                       ps.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                  ps.wi.super_Tuple3<pbrt::Vector3,_float>.z = auVar16._12_4_;
                  w.super_Tuple3<pbrt::Vector3,_float>.z =
                       ps.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                  ps._0_16_ = auVar16;
                  BVar12 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                           Flags(&local_170);
                  if ((BVar12 & Specular) == Unset) {
                    auVar36._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    auVar36._8_4_ = 0x80000000;
                    auVar36._12_4_ = 0x80000000;
                    auVar107 = ZEXT856(auVar36._8_8_);
                    auVar75._0_4_ = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar75._4_4_ = 0x80000000;
                    auVar75._8_4_ = 0x80000000;
                    auVar75._12_4_ = 0x80000000;
                    auVar70 = ZEXT856(auVar75._8_8_);
                    uVar4 = vmovlps_avx(auVar36);
                    local_218.values.values[2] = auVar75._0_4_;
                    local_218.values.values[0] = (float)(int)uVar4;
                    local_218.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
                    SVar109 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                                        (&local_170,(Vector3f *)&local_218,(Vector3f *)&local_1a0,
                                         mode);
                    auVar103._0_8_ = SVar109.values.values._8_8_;
                    auVar103._8_56_ = auVar70;
                    auVar66._0_8_ = SVar109.values.values._0_8_;
                    auVar66._8_56_ = auVar107;
                    fExit.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar66._0_16_,auVar103._0_16_);
                    bVar11 = SampledSpectrum::operator_cast_to_bool(&fExit);
                    if (bVar11) {
                      auVar37._0_8_ =
                           w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar37._8_4_ = 0x80000000;
                      auVar37._12_4_ = 0x80000000;
                      uVar4 = vmovlps_avx(auVar37);
                      local_218.values.values[2] = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                      local_218.values.values[0] = (float)(int)uVar4;
                      local_218.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
                      FVar18 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                               PDF(&local_170,(Vector3f *)&local_218,(Vector3f *)&local_1a0,mode,
                                   Transmission);
                      auVar70 = (undefined1  [56])0x0;
                      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(FVar18 * FVar18)),
                                                ZEXT416((uint)ps.pdf),ZEXT416((uint)ps.pdf));
                      local_208._0_4_ = (ps.pdf * ps.pdf) / auVar16._0_4_;
                      FVar18 = Tr(local_118,&ps.wi);
                      auVar107 = extraout_var_03;
                      SVar109 = SampledSpectrum::operator*(&beta,FVar18);
                      auVar104._0_8_ = SVar109.values.values._8_8_;
                      auVar104._8_56_ = auVar70;
                      auVar67._0_8_ = SVar109.values.values._0_8_;
                      auVar67._8_56_ = auVar107;
                      local_140.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar67._0_16_,auVar104._0_16_);
                      auVar107 = ZEXT856(local_140.values.values._8_8_);
                      SVar109 = SampledSpectrum::operator*(&local_140,&fExit);
                      auVar105._0_8_ = SVar109.values.values._8_8_;
                      auVar105._8_56_ = auVar70;
                      auVar68._0_8_ = SVar109.values.values._0_8_;
                      auVar68._8_56_ = auVar107;
                      _u_1 = (array<float,_4>)vmovlhps_avx(auVar68._0_16_,auVar105._0_16_);
                      auVar107 = (undefined1  [56])0x0;
                      SVar109 = SampledSpectrum::operator*
                                          ((SampledSpectrum *)&u_1,(Float)local_208._0_4_);
                      auVar106._0_8_ = SVar109.values.values._8_8_;
                      auVar106._8_56_ = auVar70;
                      auVar69._0_8_ = SVar109.values.values._0_8_;
                      auVar69._8_56_ = auVar107;
                      local_218.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar69._0_16_,auVar106._0_16_);
                      SampledSpectrum::operator+=(&local_e8,&local_218);
                    }
                  }
                  local_208 = ZEXT416((uint)fVar17);
                  this_01 = local_190;
                }
              }
            }
            else {
              *(long *)(in_FS_OFFSET + -0x5c0) = *(long *)(in_FS_OFFSET + -0x5c0) + 1;
            }
          }
          else {
            FVar18 = this->thickness;
            uVar4 = vcmpss_avx512f(ZEXT416((uint)FVar18),ZEXT416((uint)local_208._0_4_),0);
            local_208 = ZEXT416((uint)!(bool)((byte)uVar4 & 1) * (int)FVar18);
            FVar18 = Tr(FVar18,&w);
            SampledSpectrum::operator*=(&beta,FVar18);
LAB_0039d4f9:
            if ((local_208._0_4_ != (float)local_c8._0_4_) ||
               (NAN(local_208._0_4_) || NAN((float)local_c8._0_4_))) {
              BVar12 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                 (&local_d8);
              if ((BVar12 & Specular) == Unset) {
                BVar12 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                   (&local_170);
                FVar18 = wis.pdf;
                FVar19 = 1.0;
                if ((BVar12 & Specular) == Unset) {
                  auVar24._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar24._8_4_ = 0x80000000;
                  auVar24._12_4_ = 0x80000000;
                  uVar4 = vmovlps_avx(auVar24);
                  ps.wi.super_Tuple3<pbrt::Vector3,_float>.y =
                       -w.super_Tuple3<pbrt::Vector3,_float>.z;
                  ps.p = (Float)(int)uVar4;
                  ps.wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uVar4 >> 0x20);
                  auVar25._0_8_ =
                       wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar25._8_4_ = 0x80000000;
                  auVar25._12_4_ = 0x80000000;
                  uVar4 = vmovlps_avx(auVar25);
                  fExit.values.values[2] = -wis.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                  fExit.values.values[0] = (float)(int)uVar4;
                  fExit.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
                  FVar19 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::PDF
                                     (&local_d8,(Vector3f *)&ps,(Vector3f *)&fExit,mode,All);
                  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(FVar19 * FVar19)),ZEXT416((uint)FVar18),
                                            ZEXT416((uint)FVar18));
                  FVar19 = (FVar18 * FVar18) / auVar16._0_4_;
                }
                auVar26._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                auVar26._8_4_ = 0x80000000;
                auVar26._12_4_ = 0x80000000;
                local_150.z = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                local_150._0_8_ = vmovlps_avx(auVar26);
                auVar27._0_8_ = wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                ;
                auVar27._8_4_ = 0x80000000;
                auVar27._12_4_ = 0x80000000;
                auVar107 = ZEXT856(auVar27._8_8_);
                auVar72._0_8_ =
                     CONCAT44(0x80000000,wis.wi.super_Tuple3<pbrt::Vector3,_float>.z) ^ 0x80000000;
                auVar72._8_4_ = 0x80000000;
                auVar72._12_4_ = 0x80000000;
                auVar70 = ZEXT856(auVar72._8_8_);
                local_a8._0_8_ = vmovlps_avx(auVar27);
                local_a8.z = (float)auVar72._0_8_;
                SVar109 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                                    (&local_d8,(Vector3f *)&local_150,(Vector3f *)&local_a8,mode);
                auVar84._0_8_ = SVar109.values.values._8_8_;
                auVar84._8_56_ = auVar70;
                auVar47._0_8_ = SVar109.values.values._0_8_;
                auVar47._8_56_ = auVar107;
                _u_2 = (array<float,_4>)vmovlhps_avx(auVar47._0_16_,auVar84._0_16_);
                auVar107 = ZEXT856(u_2._8_8_);
                SVar109 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)&u_2);
                auVar85._0_8_ = SVar109.values.values._8_8_;
                auVar85._8_56_ = auVar70;
                auVar48._0_8_ = SVar109.values.values._0_8_;
                auVar48._8_56_ = auVar107;
                local_140.values.values =
                     (array<float,_4>)vmovlhps_avx(auVar48._0_16_,auVar85._0_16_);
                auVar9._8_4_ = 0x7fffffff;
                auVar9._0_8_ = 0x7fffffff7fffffff;
                auVar9._12_4_ = 0x7fffffff;
                auVar16 = vandps_avx512vl(ZEXT416((uint)wis.wi.super_Tuple3<pbrt::Vector3,_float>.z)
                                          ,auVar9);
                auVar107 = ZEXT856(auVar16._8_8_);
                SVar109 = SampledSpectrum::operator*(&local_140,auVar16._0_4_);
                auVar86._0_8_ = SVar109.values.values._8_8_;
                auVar86._8_56_ = auVar70;
                auVar49._0_8_ = SVar109.values.values._0_8_;
                auVar49._8_56_ = auVar107;
                _u_1 = (array<float,_4>)vmovlhps_avx(auVar49._0_16_,auVar86._0_16_);
                auVar107 = (undefined1  [56])0x0;
                SVar109 = SampledSpectrum::operator*((SampledSpectrum *)&u_1,FVar19);
                auVar87._0_8_ = SVar109.values.values._8_8_;
                auVar87._8_56_ = auVar70;
                auVar50._0_8_ = SVar109.values.values._0_8_;
                auVar50._8_56_ = auVar107;
                local_218.values.values =
                     (array<float,_4>)vmovlhps_avx(auVar50._0_16_,auVar87._0_16_);
                FVar18 = Tr(this->thickness,&wis.wi);
                auVar107 = extraout_var;
                SVar109 = SampledSpectrum::operator*(&local_218,FVar18);
                auVar88._0_8_ = SVar109.values.values._8_8_;
                auVar88._8_56_ = auVar70;
                auVar51._0_8_ = SVar109.values.values._0_8_;
                auVar51._8_56_ = auVar107;
                fExit.values.values = (array<float,_4>)vmovlhps_avx(auVar51._0_16_,auVar88._0_16_);
                auVar107 = ZEXT856(fExit.values.values._8_8_);
                SVar109 = SampledSpectrum::operator*(&fExit,&betaExit);
                auVar89._0_8_ = SVar109.values.values._8_8_;
                auVar89._8_56_ = auVar70;
                auVar52._0_8_ = SVar109.values.values._0_8_;
                auVar52._8_56_ = auVar107;
                ps._0_16_ = vmovlhps_avx(auVar52._0_16_,auVar89._0_16_);
                SampledSpectrum::operator+=(&local_e8,(SampledSpectrum *)&ps);
              }
              fVar17 = f::anon_class_8_1_ba1d750b::operator()(&r);
              fVar20 = f::anon_class_8_1_ba1d750b::operator()(&r);
              fVar21 = f::anon_class_8_1_ba1d750b::operator()(&r);
              u_2.super_Tuple2<pbrt::Point2,_float>.y = fVar21;
              u_2.super_Tuple2<pbrt::Point2,_float>.x = fVar20;
              auVar28._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar28._8_4_ = 0x80000000;
              auVar28._12_4_ = 0x80000000;
              uVar4 = vmovlps_avx(auVar28);
              fExit.values.values[2] = -w.super_Tuple3<pbrt::Vector3,_float>.z;
              fExit.values.values[0] = (float)(int)uVar4;
              fExit.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
              TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                        ((BSDFSample *)&ps,&local_d8,(Vector3f *)&fExit,fVar17,&u_2,mode,Reflection)
              ;
              auVar107 = ZEXT856(0);
              this_01 = local_190;
              uVar15 = local_b0;
              if ((local_1ac <= 0.0) || ((local_1b0 == 0.0 && (!NAN(local_1b0))))) break;
              auVar10._8_4_ = 0x7fffffff;
              auVar10._0_8_ = 0x7fffffff7fffffff;
              auVar10._12_4_ = 0x7fffffff;
              auVar16 = vandps_avx512vl(ZEXT416((uint)local_1b0),auVar10);
              auVar70 = ZEXT856(auVar16._8_8_);
              SVar109 = SampledSpectrum::operator*((SampledSpectrum *)&ps,auVar16._0_4_);
              auVar90._0_8_ = SVar109.values.values._8_8_;
              auVar90._8_56_ = auVar107;
              auVar53._0_8_ = SVar109.values.values._0_8_;
              auVar53._8_56_ = auVar70;
              local_218.values.values = (array<float,_4>)vmovlhps_avx(auVar53._0_16_,auVar90._0_16_)
              ;
              auVar70 = (undefined1  [56])0x0;
              SVar109 = SampledSpectrum::operator/(&local_218,local_1ac);
              auVar91._0_8_ = SVar109.values.values._8_8_;
              auVar91._8_56_ = auVar107;
              auVar54._0_8_ = SVar109.values.values._0_8_;
              auVar54._8_56_ = auVar70;
              fExit.values.values = (array<float,_4>)vmovlhps_avx(auVar54._0_16_,auVar91._0_16_);
              SampledSpectrum::operator*=(&beta,&fExit);
              w.super_Tuple3<pbrt::Vector3,_float>.y = fStack_1b4;
              w.super_Tuple3<pbrt::Vector3,_float>.x = ps.pdf;
              w.super_Tuple3<pbrt::Vector3,_float>.z = local_1b0;
              BVar12 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                 (&local_170);
              this_01 = local_190;
              if ((BVar12 & Specular) == Unset) {
                auVar29._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                auVar29._8_4_ = 0x80000000;
                auVar29._12_4_ = 0x80000000;
                auVar107 = ZEXT856(auVar29._8_8_);
                auVar73._0_4_ = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar73._4_4_ = 0x80000000;
                auVar73._8_4_ = 0x80000000;
                auVar73._12_4_ = 0x80000000;
                auVar70 = ZEXT856(auVar73._8_8_);
                uVar4 = vmovlps_avx(auVar29);
                local_218.values.values[2] = auVar73._0_4_;
                local_218.values.values[0] = (float)(int)uVar4;
                local_218.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
                SVar109 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                                    (&local_170,(Vector3f *)&local_218,(Vector3f *)&local_1a0,mode);
                auVar92._0_8_ = SVar109.values.values._8_8_;
                auVar92._8_56_ = auVar70;
                auVar55._0_8_ = SVar109.values.values._0_8_;
                auVar55._8_56_ = auVar107;
                fExit.values.values = (array<float,_4>)vmovlhps_avx(auVar55._0_16_,auVar92._0_16_);
                bVar11 = SampledSpectrum::operator_cast_to_bool(&fExit);
                if (bVar11) {
                  BVar12 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                           Flags(&local_d8);
                  FVar18 = 1.0;
                  if ((BVar12 & Specular) == Unset) {
                    auVar30._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    auVar30._8_4_ = 0x80000000;
                    auVar30._12_4_ = 0x80000000;
                    uVar4 = vmovlps_avx(auVar30);
                    local_218.values.values[2] = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                    local_218.values.values[0] = (float)(int)uVar4;
                    local_218.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
                    FVar18 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                             PDF(&local_170,(Vector3f *)&local_218,(Vector3f *)&local_1a0,mode,
                                 Transmission);
                    auVar70 = (undefined1  [56])0x0;
                    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(FVar18 * FVar18)),
                                              ZEXT416((uint)local_1ac),ZEXT416((uint)local_1ac));
                    FVar18 = (local_1ac * local_1ac) / auVar16._0_4_;
                  }
                  FVar19 = Tr(this->thickness,(Vector3f *)&ps.pdf);
                  auVar107 = extraout_var_00;
                  SVar109 = SampledSpectrum::operator*(&beta,FVar19);
                  auVar93._0_8_ = SVar109.values.values._8_8_;
                  auVar93._8_56_ = auVar70;
                  auVar56._0_8_ = SVar109.values.values._0_8_;
                  auVar56._8_56_ = auVar107;
                  local_140.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar56._0_16_,auVar93._0_16_);
                  auVar107 = ZEXT856(local_140.values.values._8_8_);
                  SVar109 = SampledSpectrum::operator*(&local_140,&fExit);
                  auVar94._0_8_ = SVar109.values.values._8_8_;
                  auVar94._8_56_ = auVar70;
                  auVar57._0_8_ = SVar109.values.values._0_8_;
                  auVar57._8_56_ = auVar107;
                  _u_1 = (array<float,_4>)vmovlhps_avx(auVar57._0_16_,auVar94._0_16_);
                  auVar107 = (undefined1  [56])0x0;
                  SVar109 = SampledSpectrum::operator*((SampledSpectrum *)&u_1,FVar18);
                  auVar95._0_8_ = SVar109.values.values._8_8_;
                  auVar95._8_56_ = auVar70;
                  auVar58._0_8_ = SVar109.values.values._0_8_;
                  auVar58._8_56_ = auVar107;
                  local_218.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar58._0_16_,auVar95._0_16_);
                  SampledSpectrum::operator+=(&local_e8,&local_218);
                }
              }
            }
            else {
              fVar17 = f::anon_class_8_1_ba1d750b::operator()(&r);
              fVar20 = f::anon_class_8_1_ba1d750b::operator()(&r);
              fVar21 = f::anon_class_8_1_ba1d750b::operator()(&r);
              u_1.super_Tuple2<pbrt::Point2,_float>.y = fVar21;
              u_1.super_Tuple2<pbrt::Point2,_float>.x = fVar20;
              auVar23._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar23._8_4_ = 0x80000000;
              auVar23._12_4_ = 0x80000000;
              uVar4 = vmovlps_avx(auVar23);
              fExit.values.values[2] = -w.super_Tuple3<pbrt::Vector3,_float>.z;
              fExit.values.values[0] = (float)(int)uVar4;
              fExit.values.values[1] = (float)(int)((ulong)uVar4 >> 0x20);
              TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                        ((BSDFSample *)&ps,&local_170,(Vector3f *)&fExit,fVar17,&u_1,mode,Reflection
                        );
              auVar107 = ZEXT856(0);
              uVar15 = local_b0;
              if ((local_1ac <= 0.0) || ((local_1b0 == 0.0 && (!NAN(local_1b0))))) break;
              auVar8._8_4_ = 0x7fffffff;
              auVar8._0_8_ = 0x7fffffff7fffffff;
              auVar8._12_4_ = 0x7fffffff;
              auVar16 = vandps_avx512vl(ZEXT416((uint)local_1b0),auVar8);
              auVar70 = ZEXT856(auVar16._8_8_);
              SVar109 = SampledSpectrum::operator*((SampledSpectrum *)&ps,auVar16._0_4_);
              auVar82._0_8_ = SVar109.values.values._8_8_;
              auVar82._8_56_ = auVar107;
              auVar45._0_8_ = SVar109.values.values._0_8_;
              auVar45._8_56_ = auVar70;
              local_218.values.values = (array<float,_4>)vmovlhps_avx(auVar45._0_16_,auVar82._0_16_)
              ;
              auVar70 = (undefined1  [56])0x0;
              SVar109 = SampledSpectrum::operator/(&local_218,local_1ac);
              auVar83._0_8_ = SVar109.values.values._8_8_;
              auVar83._8_56_ = auVar107;
              auVar46._0_8_ = SVar109.values.values._0_8_;
              auVar46._8_56_ = auVar70;
              fExit.values.values = (array<float,_4>)vmovlhps_avx(auVar46._0_16_,auVar83._0_16_);
              SampledSpectrum::operator*=(&beta,&fExit);
              w.super_Tuple3<pbrt::Vector3,_float>.y = fStack_1b4;
              w.super_Tuple3<pbrt::Vector3,_float>.x = ps.pdf;
              w.super_Tuple3<pbrt::Vector3,_float>.z = local_1b0;
            }
          }
          uVar14 = uVar14 + 1;
        }
      }
    }
    uVar15 = (ulong)((int)uVar15 + 1);
  } while( true );
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance and exit interfaces for layered BSDF
        bool enteredTop = wo.z > 0;
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface, exitInterface;
        TopOrBottomBxDF<TopBxDF, BottomBxDF> nonExitInterface;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = config.nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < config.nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            Point2f u(r(), r());
            BSDFSample wos = enterInterface.Sample_f(wo, uc, u, mode,
                                                     BxDFReflTransFlags::Transmission);
            if (!wos || wos.wi.z == 0)
                continue;

            // Sample BSDF for NEE in _wi_'s direction
            uc = r();
            u = Point2f(r(), r());
            BSDFSample wis = exitInterface.Sample_f(wi, uc, u, ~mode,
                                                    BxDFReflTransFlags::Transmission);
            if (!wis || wis.wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos.f * AbsCosTheta(wos.wi) / wos.pdf;
            SampledSpectrum betaExit = wis.f / wis.pdf;
            Vector3f w = wos.wi;
            Float z = enteredTop ? thickness : 0;
            HGPhaseFunction phase(g);

            for (int depth = 0; depth < config.maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian Roulette
                if (depth > 3 && beta.MaxComponentValue() < .25) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                if (albedo) {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / AbsCosTheta(w));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    CHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
#if 0
// TODO: cancel out and simplify: should be
// f *= AbsCosTheta(w) / sigma_t (!!!) -- that in turn makes the tricky cosine stuff
// more reasonable / palatible...
//beta *= Tr(dz, w) / ExponentialPDF(dz, sigma_t / AbsCosTheta(w));
beta *= AbsCosTheta(w) / sigma_t;
// Tricky cosines. Always divide here since we always
// include it when we leave a surface.
beta /= AbsCosTheta(w);
#endif
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis.pdf, 1, phase.PDF(-w, -wis.wi));
                        Float te = Tr(zp - exitZ, wis.wi);
                        f += beta * albedo * phase.p(-w, -wis.wi) * wt * te * betaExit;

                        // Sample phase function and update layered path state
                        PhaseFunctionSample ps = phase.Sample_p(-w, Point2f(r(), r()));
                        if (!ps || ps.wi.z == 0)
                            continue;
                        beta *= albedo * ps.p / ps.pdf;
                        w = ps.wi;
                        z = zp;

                        if (!IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_ from new _w_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float weight = PowerHeuristic(1, ps.pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps.wi) * fExit * weight;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);

                } else {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);
                }
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    BSDFSample bs = exitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || bs.pdf == 0 || bs.wi.z == 0)
                        break;
                    beta *= bs.f * AbsCosTheta(bs.wi) / bs.pdf;
                    w = bs.wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along pre-sampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis.pdf, 1,
                                                nonExitInterface.PDF(-w, -wis.wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis.wi, mode) *
                             AbsCosTheta(wis.wi) * wt * Tr(thickness, wis.wi) * betaExit;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    BSDFSample bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || bs.wi.z == 0)
                        break;
                    beta *= bs.f * AbsCosTheta(bs.wi) / bs.pdf;
                    w = bs.wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs.pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs.wi) * fExit * wt;
                        }
                    }
                }
            }
        }
        return f / config.nSamples;
    }